

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedCopyImageCS::Run(AdvancedCopyImageCS *this)

{
  bool bVar1;
  reference pvVar2;
  Vector<float,_4> *map_data_00;
  Vector<float,_4> local_98;
  Vector<float,_4> *local_88;
  vec4 *map_data;
  undefined1 local_78 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_b;
  allocator<tcu::Vector<float,_4>_> local_49;
  Vector<float,_4> local_48;
  undefined1 local_38 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  int kSize;
  AdvancedCopyImageCS *this_local;
  
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xb;
  tcu::Vector<float,_4>::Vector(&local_48,7.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38,0x79
             ,&local_48,&local_49);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_49);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,this->m_texture[0]);
  glu::CallLogWrapper::glTexStorage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,1,0x8814,0xb,0xb);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0x2800,0x2600);
  pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_38,0);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0,0,0,0xb,0xb,0x1908,0x1406,pvVar2);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,this->m_texture[1]);
  glu::CallLogWrapper::glTexStorage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,1,0x8814,0xb,0xb);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,3,this->m_texture[0],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,this->m_texture[1],0,'\0',0,0x88b9,0x8814);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_texture[1],0,'\0',0,35000,0x8814);
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_78,0x79
             ,(allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0,this->m_buffer);
  pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_78,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0x790,pvVar2,0x88e4);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x20);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->c_program);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x200);
  map_data_00 = (Vector<float,_4> *)
                glu::CallLogWrapper::glMapBufferRange
                          (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper
                            .super_CallLogWrapper,0x90d2,0,0x790,1);
  local_88 = map_data_00;
  tcu::Vector<float,_4>::Vector(&local_98,7.0);
  bVar1 = glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::
          CompareValues<tcu::Vector<float,4>>
                    ((ShaderImageLoadStoreBase *)this,map_data_00,0xb,&local_98,0,1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local = (AdvancedCopyImageCS *)0x0;
  }
  else {
    this_local = (AdvancedCopyImageCS *)&DAT_ffffffffffffffff;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_78);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const int kSize = 11;

		std::vector<vec4> data(kSize * kSize, vec4(7.0f));
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, kSize, kSize);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, GL_RGBA, GL_FLOAT, &data[0]);

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, kSize, kSize);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(3, m_texture[0], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glBindImageTexture(2, m_texture[1], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);

		std::vector<vec4> data_b(kSize * kSize);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &data_b[0], GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		vec4* map_data = (vec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);

		if (!CompareValues(map_data, kSize, vec4(7.f)))
			return ERROR;
		return NO_ERROR;
	}